

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

bool __thiscall i2p::sam::Session::Listen(Session *this,Connection *conn)

{
  _Head_base<0UL,_Sock_*,_false> _Var1;
  uint32_t uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  undefined1 local_38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_38._8_8_ = &this->m_mutex;
  local_28._M_local_buf[0] = '\0';
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_38 + 8));
  CreateIfNotCreatedAlready(this);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn->me,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_my_addr);
  uVar2 = (this->m_my_addr).super_CNetAddr.m_scope_id;
  (conn->me).super_CNetAddr.m_net = (this->m_my_addr).super_CNetAddr.m_net;
  (conn->me).super_CNetAddr.m_scope_id = uVar2;
  (conn->me).port = (this->m_my_addr).port;
  StreamAccept((Session *)local_38);
  uVar3 = local_38._0_8_;
  local_38._0_8_ = (long *)0x0;
  _Var1._M_head_impl =
       (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
       super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
       super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)uVar3;
  if (_Var1._M_head_impl != (Sock *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Sock + 8))();
    if ((long *)local_38._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_38._0_8_ + 8))();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_38 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28._8_8_) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool Session::Listen(Connection& conn)
{
    try {
        LOCK(m_mutex);
        CreateIfNotCreatedAlready();
        conn.me = m_my_addr;
        conn.sock = StreamAccept();
        return true;
    } catch (const std::runtime_error& e) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Error, "Couldn't listen: %s\n", e.what());
        CheckControlSock();
    }
    return false;
}